

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LL.cpp
# Opt level: O2

void __thiscall ll_grammar::GrammarLeft::adjust_follow(GrammarLeft *this,int index)

{
  int iVar1;
  pointer pvVar2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __position;
  int i;
  ulong uVar3;
  vector<int,_std::allocator<int>_> tempFollow;
  _Vector_base<int,_std::allocator<int>_> local_30;
  
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_30,
             (this->follow).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start +
             (this->not_finally_char_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[index]);
  for (uVar3 = 0;
      uVar3 < (ulong)((long)local_30._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_30._M_impl.super__Vector_impl_data._M_start >> 2);
      uVar3 = uVar3 + 1) {
    if ((this->elements).
        super__Vector_base<ll_grammar::ElemLeft,_std::allocator<ll_grammar::ElemLeft>_>._M_impl.
        super__Vector_impl_data._M_start[local_30._M_impl.super__Vector_impl_data._M_start[uVar3]].
        super_Elem.is_finally == false) {
      pvVar2 = (this->follow).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar1 = (this->not_finally_char_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[index];
      __position = std::
                   __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                             (pvVar2[iVar1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              *(pointer *)
                               ((long)&pvVar2[iVar1].super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data + 8),
                              local_30._M_impl.super__Vector_impl_data._M_start + uVar3);
      std::vector<int,_std::allocator<int>_>::erase
                ((this->follow).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start +
                 (this->not_finally_char_index).super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start[index],
                 (const_iterator)__position._M_current);
      if ((this->not_finally_char_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[index] !=
          local_30._M_impl.super__Vector_impl_data._M_start[uVar3]) {
        adjust_follow(this,local_30._M_impl.super__Vector_impl_data._M_start[uVar3]);
        pvVar2 = (this->follow).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        public_tool::connect_vector
                  (pvVar2 + (this->not_finally_char_index).
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[index],
                   pvVar2 + local_30._M_impl.super__Vector_impl_data._M_start[uVar3]);
      }
    }
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_30);
  return;
}

Assistant:

void GrammarLeft::adjust_follow(int index){
    //保存使用
    vector<int> tempFollow = follow[not_finally_char_index[index]];
    for (int i = 0; i < tempFollow.size(); i++){
        if (!elements[tempFollow[i]].is_finally){
            //在原来的Follow中将这个非终结符删除
            vector<int>::const_iterator deleteIt = find(follow[not_finally_char_index[index]].begin(), follow[not_finally_char_index[index]].end(), tempFollow[i]);
            follow[not_finally_char_index[index]].erase(deleteIt);

            //如果两个是一样的
            if (not_finally_char_index[index] != tempFollow[i]) {
                adjust_follow(tempFollow[i]);
                connect_vector(follow[not_finally_char_index[index]], follow[tempFollow[i]]);

            }




        }

    }

}